

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

lytype_plugin_list * lytype_find(char *module,char *revision,char *type_name)

{
  int iVar1;
  ushort local_2a;
  uint16_t u;
  char *type_name_local;
  char *revision_local;
  char *module_local;
  
  local_2a = 0;
  while( true ) {
    if (type_plugins_count <= local_2a) {
      return (lytype_plugin_list *)0x0;
    }
    iVar1 = ly_strequal_(module,type_plugins[local_2a].module);
    if (((iVar1 != 0) &&
        (((revision == (char *)0x0 && (type_plugins[local_2a].revision == (char *)0x0)) ||
         ((revision != (char *)0x0 &&
          (iVar1 = ly_strequal_(revision,type_plugins[local_2a].revision), iVar1 != 0)))))) &&
       (iVar1 = ly_strequal_(type_name,type_plugins[local_2a].name), iVar1 != 0)) break;
    local_2a = local_2a + 1;
  }
  return type_plugins + local_2a;
}

Assistant:

static struct lytype_plugin_list *
lytype_find(const char *module, const char *revision, const char *type_name)
{
    uint16_t u;

    for (u = 0; u < type_plugins_count; ++u) {
        if (ly_strequal(module, type_plugins[u].module, 0) && ((!revision && !type_plugins[u].revision)
                || (revision && ly_strequal(revision, type_plugins[u].revision, 0)))
                && ly_strequal(type_name, type_plugins[u].name, 0)) {
            return &(type_plugins[u]);
        }
    }

    return NULL;
}